

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModuleHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>&,slang::syntax::ParameterPortListSyntax*,slang::syntax::PortListSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,Token *args_3,
          SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *args_4,
          ParameterPortListSyntax **args_5,PortListSyntax **args_6,Token *args_7)

{
  ParameterPortListSyntax *pPVar1;
  PortListSyntax *pPVar2;
  size_t sVar3;
  pointer ppPVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  SyntaxNode *pSVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  undefined4 uVar22;
  TokenKind TVar23;
  undefined1 uVar24;
  NumericTokenFlags NVar25;
  uint32_t uVar26;
  ModuleHeaderSyntax *pMVar27;
  long lVar28;
  
  pMVar27 = (ModuleHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModuleHeaderSyntax *)this->endPtr < pMVar27 + 1) {
    pMVar27 = (ModuleHeaderSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pMVar27 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar5 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar6 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar7 = args_3->info;
  pPVar1 = *args_5;
  pPVar2 = *args_6;
  TVar23 = args_7->kind;
  uVar24 = args_7->field_0x2;
  NVar25.raw = (args_7->numFlags).raw;
  uVar26 = args_7->rawLen;
  pIVar8 = args_7->info;
  (pMVar27->super_SyntaxNode).kind = *args;
  (pMVar27->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar27->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pMVar27->moduleKeyword).kind = TVar10;
  (pMVar27->moduleKeyword).field_0x2 = uVar11;
  (pMVar27->moduleKeyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (pMVar27->moduleKeyword).rawLen = uVar13;
  (pMVar27->moduleKeyword).info = pIVar5;
  (pMVar27->lifetime).kind = TVar14;
  (pMVar27->lifetime).field_0x2 = uVar15;
  (pMVar27->lifetime).numFlags = (NumericTokenFlags)NVar16.raw;
  (pMVar27->lifetime).rawLen = uVar17;
  (pMVar27->lifetime).info = pIVar6;
  (pMVar27->name).kind = TVar18;
  (pMVar27->name).field_0x2 = uVar19;
  (pMVar27->name).numFlags = (NumericTokenFlags)NVar20.raw;
  (pMVar27->name).rawLen = uVar21;
  (pMVar27->name).info = pIVar7;
  uVar22 = *(undefined4 *)&(args_4->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar9 = (args_4->super_SyntaxListBase).super_SyntaxNode.parent;
  (pMVar27->imports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_4->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar27->imports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar22;
  (pMVar27->imports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar9;
  (pMVar27->imports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_4->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pMVar27->imports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (pMVar27->imports).super_SyntaxListBase.childCount = (args_4->super_SyntaxListBase).childCount;
  sVar3 = (args_4->
          super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pMVar27->imports).
  super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_ptr =
       (args_4->super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>)
       ._M_ptr;
  (pMVar27->imports).
  super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pMVar27->imports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005dbc50;
  pMVar27->parameters = pPVar1;
  pMVar27->ports = pPVar2;
  (pMVar27->semi).kind = TVar23;
  (pMVar27->semi).field_0x2 = uVar24;
  (pMVar27->semi).numFlags = (NumericTokenFlags)NVar25.raw;
  (pMVar27->semi).rawLen = uVar26;
  (pMVar27->semi).info = pIVar8;
  (pMVar27->imports).super_SyntaxListBase.super_SyntaxNode.parent = &pMVar27->super_SyntaxNode;
  sVar3 = (pMVar27->imports).
          super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar3 != 0) {
    ppPVar4 = (pMVar27->imports).
              super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar28 = 0;
    do {
      *(ModuleHeaderSyntax **)(*(long *)((long)ppPVar4 + lVar28) + 8) = pMVar27;
      lVar28 = lVar28 + 8;
    } while (sVar3 << 3 != lVar28);
  }
  if (pPVar1 != (ParameterPortListSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = &pMVar27->super_SyntaxNode;
  }
  if (pPVar2 != (PortListSyntax *)0x0) {
    (pPVar2->super_SyntaxNode).parent = &pMVar27->super_SyntaxNode;
  }
  return pMVar27;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }